

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_infer(bitstream *str,uint32_t *val,uint32_t ival)

{
  uint in_EDX;
  uint *in_RSI;
  int *in_RDI;
  
  if (*in_RDI == 0) {
    if (*in_RSI != in_EDX) {
      fprintf(_stderr,"Wrong infered value: %d != %d\n",(ulong)*in_RSI,(ulong)in_EDX);
      return 1;
    }
  }
  else {
    *in_RSI = in_EDX;
  }
  return 0;
}

Assistant:

int vs_infer(struct bitstream *str, uint32_t *val, uint32_t ival) {
	if (str->dir == VS_ENCODE) {
		if (*val != ival) {
			fprintf (stderr, "Wrong infered value: %d != %d\n", *val, ival);
			return 1;
		}
	} else {
		*val = ival;
	}
	return 0;
}